

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<Implicit_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<Implicit_const&> *this,Implicit *rhs)

{
  int iVar1;
  int iVar2;
  lest *this_00;
  Implicit *in_R8;
  allocator local_d1;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  undefined1 local_50 [40];
  
  this_00 = *(lest **)this;
  iVar2 = *(int *)this_00;
  iVar1 = rhs->x;
  std::__cxx11::string::string((string *)&local_d0,"==",&local_d1);
  local_90 = local_80;
  if (local_d0 == local_c0) {
    uStack_78 = uStack_b8;
  }
  else {
    local_90 = local_d0;
  }
  local_88 = local_c8;
  local_c8 = 0;
  local_c0[0] = 0;
  local_d0 = local_c0;
  to_string<Implicit,Implicit>(&local_b0,this_00,(Implicit *)&local_90,(string *)rhs,in_R8);
  local_68 = local_b0._M_string_length;
  local_70 = local_60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    uStack_58 = local_b0.field_2._8_8_;
  }
  else {
    local_70 = local_b0._M_dataplus._M_p;
  }
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_50[0] = iVar2 == iVar1;
  std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_70);
  result::result(__return_storage_ptr__,(result *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }